

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

double hdr_mean(hdr_histogram *h)

{
  long lVar1;
  int64_t iVar2;
  _Bool _Var3;
  int64_t iVar4;
  int64_t total_count;
  int64_t count;
  int64_t total;
  hdr_iter iter;
  hdr_histogram *h_local;
  
  count = 0;
  total_count = 0;
  lVar1 = h->total_count;
  iter._next_fp = (_func__Bool_hdr_iter_ptr *)h;
  hdr_iter_init((hdr_iter *)&total,h);
  while (_Var3 = hdr_iter_next((hdr_iter *)&total), iVar2 = iter.total_count,
        _Var3 && total_count < lVar1) {
    if (iter.total_count != 0) {
      total_count = iter.total_count + total_count;
      iVar4 = hdr_median_equivalent_value((hdr_histogram *)iter._next_fp,iter.cumulative_count);
      count = iVar2 * iVar4 + count;
    }
  }
  return ((double)count * 1.0) / (double)lVar1;
}

Assistant:

double hdr_mean(const struct hdr_histogram* h)
{
    struct hdr_iter iter;
    int64_t total = 0, count = 0;
    int64_t total_count = h->total_count;

    hdr_iter_init(&iter, h);

    while (hdr_iter_next(&iter) && count < total_count)
    {
        if (0 != iter.count)
        {
            count += iter.count;
            total += iter.count * hdr_median_equivalent_value(h, iter.value);
        }
    }

    return (total * 1.0) / total_count;
}